

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_fread(void *el)

{
  XMLElement *this;
  FILE *__stream;
  XMLError XVar1;
  _Rb_tree_color _Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  iterator iVar6;
  iterator iVar7;
  size_t sVar8;
  _Rb_tree_color _Var9;
  uint32_t uVar10;
  allocator local_55;
  int sz;
  key_type local_50;
  
  this = *el;
  pcVar3 = get_attr_val((XMLElement **)el,"handle");
  pcVar4 = get_attr_val((XMLElement **)el,"memory");
  pcVar5 = get_attr_val((XMLElement **)el,"type");
  sz = 0;
  XVar1 = tinyxml2::XMLElement::QueryIntAttribute(this,"size",&sz);
  if (pcVar4 == (char *)0x0 || pcVar3 == (char *)0x0) {
    uVar10 = 5;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,pcVar3,&local_55);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                    *)gCmdMemMap_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar10 = 7;
    if (iVar6._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
      __stream = (FILE *)iVar6._M_node[2]._M_parent;
      std::__cxx11::string::string((string *)&local_50,pcVar4,&local_55);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                      *)gCmdMemMap_abi_cxx11_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (iVar6._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
        pcVar3 = "char";
        if (pcVar5 != (char *)0x0) {
          pcVar3 = pcVar5;
        }
        std::__cxx11::string::string((string *)&local_50,pcVar3,&local_55);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)gBaseTypeMap_abi_cxx11_,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (iVar7._M_node == (_Base_ptr)(gBaseTypeMap_abi_cxx11_ + 8)) {
          uVar10 = 6;
        }
        else {
          if (XVar1 == XML_NO_ERROR) {
            _Var2 = sz * iVar7._M_node[2]._M_color;
            _Var9 = iVar6._M_node[2]._M_color;
            if (_Var9 <= _Var2) {
              _Var2 = _Var9;
            }
          }
          else {
            _Var9 = iVar6._M_node[2]._M_color;
            _Var2 = _Var9;
          }
          if (_Var2 < _Var9) {
            _Var9 = _Var2;
          }
          sVar8 = fread(iVar6._M_node[2]._M_parent,1,(ulong)_Var9,__stream);
          setret((uint32_t)sVar8);
          uVar10 = 0;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

uint32_t ivk::cmd_fread(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* me = get_attr_val(ep,"memory");
    const char* ty = get_attr_val(ep,"type");
    int sz=0;
    XMLError er = e->QueryIntAttribute("size",&sz);
    if(!hd || !me){
        return proc_xml_err;
    }

    // 查找文件句柄
    map<string,proc_data>::iterator it = gCmdMemMap.find(hd);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    FILE* f = (FILE*)it->second.data;

    // 查找内存
    map<string,proc_data>::iterator itm = gCmdMemMap.find(me);
    if(itm==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 获取类型信息,如果没有指定类型,默认char
    map<string,uint32_t>::iterator itt = gBaseTypeMap.find(ty?ty:"char");
    if(itt==gBaseTypeMap.end()){
        return proc_type_err;
    }
    uint32_t type_size = itt->second;

    // 真正读取的内存空间
    uint32_t mem_size = 0;
    if(er==XML_NO_ERROR){
        if(sz*type_size>itm->second.size){
            mem_size = itm->second.size;
        }else{
            mem_size = sz*type_size;
        }
    }else{
        mem_size = itm->second.size;
    }

    // 如果大小过大则以内存空间大小为准
    if(mem_size>itm->second.size){
        mem_size = itm->second.size;
    }
    uint32_t ret = (uint32_t)fread(itm->second.data,1,mem_size,f);

    // 设置返回值为读取字节大小
    ivk::setret(ret);

    return proc_success;
}